

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall
Variable_hasIndirectEquivalentVariable_Test::TestBody
          (Variable_hasIndirectEquivalentVariable_Test *this)

{
  char cVar1;
  AssertionResult gtest_ar_;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  long *local_80;
  AssertHelper local_78 [8];
  char local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  shared_ptr local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long *local_30 [2];
  long local_20 [2];
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence((shared_ptr *)&local_40,local_50);
  libcellml::Variable::addEquivalence(local_50,local_60);
  local_70[0] = libcellml::Variable::hasEquivalentVariable(local_40,SUB81(local_60,0));
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_30,local_70,"v1->hasEquivalentVariable(v3, true)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x76,(char *)local_30[0]);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Variable, hasIndirectEquivalentVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);
    EXPECT_TRUE(v1->hasEquivalentVariable(v3, true));
}